

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstructCondense.cpp
# Opt level: O0

void __thiscall
TPZDohrSubstructCondense<double>::Print(TPZDohrSubstructCondense<double> *this,ostream *out)

{
  ostream *poVar1;
  void *pvVar2;
  TPZMatRed<double,_TPZFMatrix<double>_> *pTVar3;
  ostream *in_RSI;
  long in_RDI;
  ENumbering unaff_retaddr;
  ENumbering unaff_retaddr_00;
  TPZVec<int> *exteq;
  TPZVec<int> *internaleq;
  MatrixOutputFormat in_stack_0000035c;
  ostream *in_stack_00000360;
  char *in_stack_00000368;
  TPZMatrix<double> *in_stack_00000370;
  
  poVar1 = std::operator<<(in_RSI,
                           "void TPZDohrSubstructCondense<double>::Print(std::ostream &) const [TVar = double]"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RSI,"fNEquations ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,*(int *)(in_RDI + 0x10));
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RSI,"fNumInternalEquations ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,*(int *)(in_RDI + 0x14));
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RSI,"fNumExternalEquations ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,*(int *)(in_RDI + 0x18));
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  GatherVec((TPZDohrSubstructCondense<double> *)exteq,unaff_retaddr_00,unaff_retaddr);
  std::operator<<(in_RSI,"Internal equations-first-Gather ");
  poVar1 = ::operator<<((ostream *)this,(TPZVec<int> *)out);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  GatherVec((TPZDohrSubstructCondense<double> *)exteq,unaff_retaddr_00,unaff_retaddr);
  std::operator<<(in_RSI,"External equations-first-Gather ");
  poVar1 = ::operator<<((ostream *)this,(TPZVec<int> *)out);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<(in_RSI,"Numbering of the Coarse nodes in the global mesh fCoarseNodes ");
  poVar1 = ::operator<<((ostream *)this,(TPZVec<int> *)out);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  pTVar3 = TPZAutoPointer<TPZMatRed<double,_TPZFMatrix<double>_>_>::operator->
                     ((TPZAutoPointer<TPZMatRed<double,_TPZFMatrix<double>_>_> *)(in_RDI + 8));
  (*(pTVar3->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x1c])
            (pTVar3,"The matrix which computes phi and fKCi ",in_RSI,2);
  pTVar3 = TPZAutoPointer<TPZMatRed<double,_TPZFMatrix<double>_>_>::operator->
                     ((TPZAutoPointer<TPZMatRed<double,_TPZFMatrix<double>_>_> *)(in_RDI + 0x298));
  (*(pTVar3->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x1c])
            (pTVar3,"The matrix with the internal nodes condensed ",in_RSI,2);
  TPZMatrix<double>::Print(in_stack_00000370,in_stack_00000368,in_stack_00000360,in_stack_0000035c);
  TPZMatrix<double>::Print(in_stack_00000370,in_stack_00000368,in_stack_00000360,in_stack_0000035c);
  std::operator<<(in_RSI,"fWeights = ");
  poVar1 = ::operator<<((ostream *)this,(TPZVec<double> *)out);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  TPZMatrix<double>::Print(in_stack_00000370,in_stack_00000368,in_stack_00000360,in_stack_0000035c);
  TPZMatrix<double>::Print(in_stack_00000370,in_stack_00000368,in_stack_00000360,in_stack_0000035c);
  TPZMatrix<double>::Print(in_stack_00000370,in_stack_00000368,in_stack_00000360,in_stack_0000035c);
  TPZMatrix<double>::Print(in_stack_00000370,in_stack_00000368,in_stack_00000360,in_stack_0000035c);
  return;
}

Assistant:

void TPZDohrSubstructCondense<TVar>::Print(std::ostream &out) const
{
	out << __PRETTY_FUNCTION__ << std::endl;
	out << "fNEquations " << fNEquations << std::endl;
	out << "fNumInternalEquations " << fNumInternalEquations << std::endl;
	out << "fNumExternalEquations " << fNumExternalEquations << std::endl;
	const TPZVec<int> &internaleq = GatherVec(Submesh, InternalFirst);
	out << "Internal equations-first-Gather " << internaleq << std::endl;
	const TPZVec<int> &exteq = GatherVec(Submesh, ExternalFirst);
	out << "External equations-first-Gather " << exteq << std::endl;
	out << "Numbering of the Coarse nodes in the global mesh fCoarseNodes " << fCoarseNodes << std::endl;
	fMatRedComplete->Print("The matrix which computes phi and fKCi ",out,EMathematicaInput);
	fMatRed->Print("The matrix with the internal nodes condensed ", out,EMathematicaInput);
	fKCi.Print("Coarse Matrix fKCi",out);
	fPhiC.Print("fPhiC : ",out,EMathematicaInput);
	out << "fWeights = " << fWeights  << endl;
	fPhiC_Weighted_Condensed.Print("fPhiC_Weighted_Condensed", out);
	fLocalLoad.Print("fLocalLoad ", out);
	fLocalWeightedResidual.Print("fLocalWeightedResidual ", out);
	fAdjustSolution.Print("fAdjustSolution", out);
}